

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_heap.cpp
# Opt level: O2

bool __thiscall
ON_SubD_FixedSizeHeap::ReserveSubDWorkspace(ON_SubD_FixedSizeHeap *this,ON_SubDFace *center_face0)

{
  ushort uVar1;
  ON_SubDVertex *this_00;
  ON_SubDFace *pOVar2;
  uint uVar14;
  bool bVar3;
  bool bVar4;
  ushort uVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  ON_SubDEdge *pOVar9;
  byte bVar10;
  ushort uVar11;
  ulong uVar12;
  uint uVar13;
  ON_SubDEdgePtr *pOVar15;
  uint uVar16;
  uint uVar17;
  size_t local_50;
  
  if (center_face0 == (ON_SubDFace *)0x0) {
    Destroy(this);
    bVar3 = true;
  }
  else {
    uVar1 = center_face0->m_edge_count;
    if ((2 < uVar1) &&
       (pOVar9 = ON_SubDFace::Edge(center_face0,uVar1 - 1), pOVar9 != (ON_SubDEdge *)0x0)) {
      uVar13 = 4;
      if (4 < uVar1) {
        uVar13 = (uint)uVar1;
      }
      pOVar15 = center_face0->m_edge4;
      bVar3 = ON_SubDEdge::IsHardCrease(pOVar9);
      local_50 = 0;
      iVar6 = 0;
      bVar10 = 0;
      uVar7 = 0;
      do {
        uVar16 = (uint)uVar1;
        if (uVar7 == uVar16) {
LAB_00612e4c:
          iVar8 = (int)local_50 - uVar16;
          uVar7 = ON_SubDComponentBase::SubdivisionLevel(&center_face0->super_ON_SubDComponentBase);
          bVar3 = Internal_ReserveSubDWorkspace
                            (this,(ulong)(iVar8 * 2 + 1),local_50,
                             (ulong)(iVar8 * 8 + (iVar6 + uVar13) * 2),(bool)(uVar7 == 0 | bVar10));
          return bVar3;
        }
        if ((uVar7 == 4) && (pOVar15 = center_face0->m_edgex, pOVar15 == (ON_SubDEdgePtr *)0x0)) {
LAB_00612e40:
          if (uVar7 != uVar16) break;
          goto LAB_00612e4c;
        }
        uVar12 = pOVar15->m_ptr;
        pOVar9 = (ON_SubDEdge *)(uVar12 & 0xfffffffffffffff8);
        if (pOVar9 == (ON_SubDEdge *)0x0) goto LAB_00612e40;
        bVar4 = ON_SubDEdge::IsHardCrease(pOVar9);
        this_00 = pOVar9->m_vertex[(uint)uVar12 & 1];
        if (((this_00 == (ON_SubDVertex *)0x0) || (uVar5 = this_00->m_edge_count, uVar5 < 2)) ||
           (uVar11 = this_00->m_face_count, uVar5 < uVar11)) goto LAB_00612e40;
        uVar17 = (uint)uVar5;
        uVar16 = 4;
        if (4 < uVar5) {
          uVar16 = (uint)uVar5;
        }
        if ((bVar3 & bVar4) == 1) {
          bVar3 = ON_SubDVertex::IsCreaseOrCorner(this_00);
          if (!bVar3) {
            uVar5 = this_00->m_edge_count;
            uVar11 = this_00->m_face_count;
            goto LAB_00612db4;
          }
        }
        else {
LAB_00612db4:
          for (uVar12 = 0; uVar11 != uVar12; uVar12 = uVar12 + 1) {
            pOVar2 = this_00->m_faces[uVar12];
            if (pOVar2 != center_face0 && pOVar2 != (ON_SubDFace *)0x0) {
              uVar14._0_2_ = pOVar2->m_edge_count;
              uVar14._2_2_ = pOVar2->m_edgex_capacity;
              if ((ushort)(undefined2)uVar14 < 5) {
                uVar14 = 4;
              }
              uVar13 = uVar13 + (uVar14 & 0xffff);
            }
          }
          bVar10 = bVar10 | uVar5 == 2;
        }
        local_50 = (size_t)((int)local_50 + uVar17);
        iVar6 = iVar6 + uVar16;
        uVar7 = uVar7 + 1;
        pOVar15 = pOVar15 + 1;
        bVar3 = bVar4;
      } while( true );
    }
    Destroy(this);
    ON_SubDIncrementErrorCount();
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool ON_SubD_FixedSizeHeap::ReserveSubDWorkspace(
  const ON_SubDFace* center_face0
  )
{
  unsigned int v_capacity =  0;
  unsigned int f_capacity =  0;
  unsigned int a_capacity =  0;

  for (;;)
  {
    if (nullptr == center_face0)
      break;

    const unsigned int N = center_face0->m_edge_count;
    if (N <= 2)
      break;

    unsigned int S = 0;  // Set S = sum of the number of edges attached to each vertex of center_face0.
    unsigned int T = Internal_AtLeast4(N);  // Set T = capacity required for vertex edge arrays on face subdivision vertices
    unsigned int X = 0;
    bool bValenceTwoVertices = false; // bValenceTwoVertices = true if center_face0 has a valence 2 vertex and we need the hash table
    {
      const ON_SubDEdgePtr* edges = center_face0->m_edge4;
      ON__UINT_PTR edge_ptr;
      const ON_SubDEdge* edge;
      const ON_SubDVertex* vertex;
      const ON_SubDFace* vertex_face;
      unsigned int fei;
      edge = center_face0->Edge(N - 1);
      if (nullptr == edge)
        break;
      bool bEdgeIsHardCrease[2] = { false, edge->IsHardCrease() };
      for (fei = 0; fei < N; fei++, edges++)
      {
        if (4 == fei)
        {
          edges = center_face0->m_edgex;
          if (nullptr == edges)
            break;
        }
        edge_ptr = edges->m_ptr;
        edge = ON_SUBD_EDGE_POINTER(edge_ptr);
        if (nullptr == edge)
          break;
        bEdgeIsHardCrease[0] = bEdgeIsHardCrease[1];
        bEdgeIsHardCrease[1] = edge->IsHardCrease();
        vertex = edge->m_vertex[ON_SUBD_EDGE_DIRECTION(edge_ptr)];
        if (nullptr == vertex)
          break;
        if (vertex->m_edge_count < 2)
          break;
        if (vertex->m_edge_count < vertex->m_face_count)
          break;
        S += vertex->m_edge_count;
        X += Internal_AtLeast4(vertex->m_edge_count);
        if ( bEdgeIsHardCrease[0] && bEdgeIsHardCrease[1] && vertex->IsCreaseOrCorner() )
        {
          // If this vertex has multiple sectors, the other sectors are isolated from center_face0 by hard creases.
          continue;
        }
        if (2 == vertex->m_edge_count)
        {
          // ring face has valence 2 vertex and the subdivision point for vertex_face
          // may be reference by 2 different edges from center_face0
          bValenceTwoVertices = true;
        }
        for (unsigned short vfi = 0; vfi < vertex->m_face_count; ++vfi)
        {
          vertex_face = vertex->m_faces[vfi];
          if (nullptr == vertex_face || center_face0 == vertex_face)
            continue;
          T += Internal_AtLeast4(vertex_face->m_edge_count);
        }
      }
      if (fei != N)
        break;
    }

    // NOTE: S >= 2*N
    v_capacity =  2*(S - N) + 1; // maximum possible and occurs when all face0 edges are distinct and smooth
    f_capacity =  S;  // maximum possible and occurs when all face0 edges are distinct and smooth

    // T = capacity required for vertex edge arrays on face subdivision vertices
    // 4*(S-N) = capacity required for vertex edge arrays on edge subdivision vertices
    // X = capacity required for vertex edge arrays on vertex subdivision vertices
    //
    a_capacity = 2*( X + T + 4 * (S - N) ); // Twice the number of edges from all subdivision vertices.

    return Internal_ReserveSubDWorkspace(
      v_capacity,
      f_capacity,
      a_capacity,
      (0U == center_face0->SubdivisionLevel()) || bValenceTwoVertices
    );
  }

  Destroy();
  if (nullptr == center_face0 )
    return true;

  return ON_SUBD_RETURN_ERROR(false);
}